

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

_Bool mpack_expect_array_max_or_nil(mpack_reader_t *reader,uint32_t max_count,uint32_t *count)

{
  _Bool _Var1;
  
  _Var1 = mpack_expect_array_or_nil(reader,count);
  if ((_Var1) && (max_count < *count)) {
    *count = 0;
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool mpack_expect_array_max_or_nil(mpack_reader_t* reader, uint32_t max_count, uint32_t* count) {
    mpack_assert(count != NULL, "count cannot be NULL");

    bool has_array = mpack_expect_array_or_nil(reader, count);
    if (has_array && *count > max_count) {
        *count = 0;
        mpack_reader_flag_error(reader, mpack_error_type);
        return false;
    }
    return has_array;
}